

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

int __thiscall
MPLSParser::composePip_metadata
          (MPLSParser *this,uint8_t *buffer,int bufferSize,
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          *pmtIndexList)

{
  int iVar1;
  uint uVar2;
  PipCorner PVar3;
  value_type *pvVar4;
  bool bVar5;
  uint32_t uVar6;
  uint *puVar7;
  int iVar8;
  uint *puVar9;
  uint uVar10;
  MPLSStreamInfo *si;
  value_type *__x;
  uint uVar11;
  uint value;
  long lVar12;
  pointer pMVar13;
  pointer pmVar14;
  pointer pMVar15;
  pointer pmVar16;
  uint uVar17;
  ulong uVar18;
  float fVar19;
  BitStreamWriter writer;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> pipStreams;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> blockDataAddressPos;
  uint local_c4;
  BitStreamWriter local_b8;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> local_98;
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  *local_80;
  ulong local_78;
  ulong local_70;
  void *local_68;
  undefined8 uStack_60;
  long local_58;
  uint32_t *local_50;
  MPLSParser *local_48;
  long local_40;
  uint *local_38;
  
  local_b8.super_BitStream.m_totalBits = 0;
  local_b8.super_BitStream.m_buffer = (uint *)0x0;
  local_b8.super_BitStream.m_initBuffer = (uint *)0x0;
  local_b8.m_curVal = 0;
  local_b8.m_bitWrited = 0;
  local_80 = pmtIndexList;
  BitStream::setBuffer(&local_b8.super_BitStream,buffer,buffer + bufferSize);
  local_b8.m_curVal = 0;
  local_b8.m_bitWrited = 0;
  BitStreamWriter::putBits(&local_b8,0x20,0);
  local_70 = 0;
  local_98.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_c4 = 0;
  uVar11 = 0;
  local_48 = this;
  if (__x != pvVar4) {
    local_c4 = 0;
    local_70 = 0;
    do {
      bVar5 = isVideoStreamType((__x->super_M2TSStreamInfo).stream_coding_type);
      if (bVar5) {
        if ((__x->super_M2TSStreamInfo).isSecondary == true) {
          std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::push_back(&local_98,__x);
        }
        else {
          local_70 = (ulong)(__x->super_M2TSStreamInfo).width;
          local_c4 = (__x->super_M2TSStreamInfo).height;
        }
      }
      __x = __x + 1;
    } while (__x != pvVar4);
    uVar11 = (int)((ulong)((long)local_98.
                                 super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98.
                                super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249;
  }
  uVar17 = (int)((ulong)((long)(local_80->
                               super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_80->
                              super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  local_50 = (uint32_t *)buffer;
  BitStreamWriter::putBits(&local_b8,0x10,uVar11 * uVar17);
  local_68 = (void *)0x0;
  uStack_60 = 0;
  local_58 = 0;
  if (uVar17 != 0) {
    uVar10 = 0;
    do {
      if (uVar11 != 0) {
        lVar12 = 0x68;
        uVar18 = 0;
        do {
          uVar2 = *(uint *)(((local_98.
                              super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_M2TSStreamInfo).
                            language_code + lVar12 + -0x20);
          BitStreamWriter::putBits(&local_b8,0x10,uVar10);
          BitStreamWriter::putBits(&local_b8,8,(uint)uVar18);
          BitStreamWriter::putBits(&local_b8,8,0);
          BitStreamWriter::putBits(&local_b8,4,~uVar2 >> 0x1f);
          BitStreamWriter::putBits(&local_b8,1,1);
          BitStreamWriter::putBits(&local_b8,1,1);
          BitStreamWriter::putBits(&local_b8,10,0);
          BitStreamWriter::putBits(&local_b8,8,0);
          if ((int)uVar2 < 0) {
            uVar2 = 0;
          }
          BitStreamWriter::putBits(&local_b8,8,uVar2);
          BitStreamWriter::putBits(&local_b8,0x10,0);
          iVar8 = (int)local_b8.super_BitStream.m_buffer -
                  (int)local_b8.super_BitStream.m_initBuffer;
          iVar1 = local_b8.m_bitWrited + iVar8 * 8;
          iVar8 = local_b8.m_bitWrited + iVar8 * 8 + 7;
          if (-1 < iVar1) {
            iVar8 = iVar1;
          }
          local_38 = (uint *)((long)(iVar8 >> 3) + (long)local_b8.super_BitStream.m_initBuffer);
          std::vector<unsigned_int*,std::allocator<unsigned_int*>>::emplace_back<unsigned_int*>
                    ((vector<unsigned_int*,std::allocator<unsigned_int*>> *)&local_68,&local_38);
          BitStreamWriter::putBits(&local_b8,0x20,0);
          uVar18 = uVar18 + 1;
          lVar12 = lVar12 + 0x70;
        } while (uVar11 != uVar18);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar17);
  }
  while ((local_b8.m_bitWrited +
          ((int)local_b8.super_BitStream.m_buffer - (int)local_b8.super_BitStream.m_initBuffer) * 8
         & 0xf) != 0) {
    BitStreamWriter::putBits(&local_b8,1,0);
  }
  pmVar14 = (local_80->
            super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pmVar16 = (local_80->
            super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar16 != pmVar14) {
    local_78 = 0;
    puVar7 = local_b8.super_BitStream.m_buffer;
    puVar9 = local_b8.super_BitStream.m_initBuffer;
    pMVar13 = local_98.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar15 = local_98.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar11 = local_b8.m_bitWrited;
    do {
      bVar5 = pMVar15 != pMVar13;
      pMVar15 = pMVar13;
      if (bVar5) {
        local_40 = local_78 * 0x6db6db6db6db6db8;
        uVar18 = 0;
        do {
          uVar17 = pMVar13[uVar18].pipParams.scaleIndex;
          PVar3 = pMVar13[uVar18].pipParams.corner;
          uVar10 = pMVar13[uVar18].pipParams.hOffset;
          uVar2 = pMVar13[uVar18].pipParams.vOffset;
          iVar8 = (int)puVar7 - (int)puVar9;
          iVar1 = uVar11 + iVar8 * 8;
          iVar8 = uVar11 + iVar8 * 8 + 7;
          if (-1 < iVar1) {
            iVar8 = iVar1;
          }
          uVar6 = my_ntohl(iVar8 >> 3);
          **(uint32_t **)
            ((long)local_68 +
            uVar18 * 8 +
            ((long)local_98.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4) * local_40) = uVar6;
          BitStreamWriter::putBits(&local_b8,0x10,1);
          if (local_78 == 0) {
LAB_001e3320:
            BitStreamWriter::putBits(&local_b8,0x20,local_48->IN_time);
          }
          else {
            pmVar14 = (local_80->
                      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (*(size_t *)((long)&pmVar14[local_78 - 1]._M_t._M_impl.super__Rb_tree_header + 0x20)
                == 0) goto LAB_001e3320;
            BitStreamWriter::putBits
                      (&local_b8,0x20,
                       (uint)(*(ulong *)(*(_Base_ptr *)
                                          ((long)&pmVar14[local_78]._M_t._M_impl.
                                                  super__Rb_tree_header + 0x10) + 1) >> 1));
          }
          uVar11 = 0;
          value = 0;
          if (uVar17 != 5) {
            fVar19 = 1.0;
            if (uVar17 - 2 < 3) {
              fVar19 = *(float *)(&DAT_0020d370 + (ulong)(uVar17 - 2) * 4);
            }
            if (PVar3 - TopRight < 2) {
              uVar10 = (int)local_70 -
                       (uVar10 + (int)((float)local_98.
                                              super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                              super_M2TSStreamInfo.width * fVar19));
            }
            uVar11 = uVar10;
            value = local_c4 -
                    ((int)(fVar19 * (float)local_98.
                                           super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                           super_M2TSStreamInfo.height) + uVar2);
            if ((PVar3 & ~TopRight) != BottomRight) {
              value = uVar2;
            }
          }
          BitStreamWriter::putBits(&local_b8,0xc,uVar11);
          BitStreamWriter::putBits(&local_b8,0xc,value);
          BitStreamWriter::putBits(&local_b8,4,uVar17);
          BitStreamWriter::putBits(&local_b8,4,0);
          while ((local_b8.m_bitWrited +
                  ((int)local_b8.super_BitStream.m_buffer -
                  (int)local_b8.super_BitStream.m_initBuffer) * 8 & 0xf) != 0) {
            BitStreamWriter::putBits(&local_b8,1,0);
          }
          uVar18 = uVar18 + 1;
          puVar7 = local_b8.super_BitStream.m_buffer;
          puVar9 = local_b8.super_BitStream.m_initBuffer;
          pMVar13 = local_98.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar11 = local_b8.m_bitWrited;
        } while (uVar18 < (ulong)(((long)local_98.
                                         super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_98.
                                         super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 0x6db6db6db6db6db7));
        pmVar14 = (local_80->
                  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pmVar16 = (local_80->
                  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        pMVar15 = local_98.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      local_78 = local_78 + 1;
    } while (local_78 < (ulong)(((long)pmVar16 - (long)pmVar14 >> 4) * -0x5555555555555555));
  }
  BitStreamWriter::flushBits(&local_b8);
  iVar1 = local_b8.m_bitWrited +
          ((int)local_b8.super_BitStream.m_buffer - (int)local_b8.super_BitStream.m_initBuffer) * 8;
  iVar8 = local_b8.m_bitWrited +
          ((int)local_b8.super_BitStream.m_buffer - (int)local_b8.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar1) {
    iVar8 = iVar1;
  }
  uVar6 = my_ntohl((iVar8 >> 3) - 4);
  puVar9 = local_b8.super_BitStream.m_initBuffer;
  puVar7 = local_b8.super_BitStream.m_buffer;
  *local_50 = uVar6;
  uVar11 = local_b8.m_bitWrited;
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  iVar8 = (int)puVar7 - (int)puVar9;
  iVar1 = uVar11 + iVar8 * 8;
  iVar8 = uVar11 + iVar8 * 8 + 7;
  if (-1 < iVar1) {
    iVar8 = iVar1;
  }
  std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector(&local_98);
  return iVar8 >> 3;
}

Assistant:

int MPLSParser::composePip_metadata(uint8_t* buffer, const int bufferSize,
                                    const std::vector<PMTIndex>& pmtIndexList) const
{
    // The ID1 value and the ID2 value of the ExtensionData() shall be set to 0x0001 and 0x0001
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    const auto lengthPos = reinterpret_cast<uint32_t*>(buffer);
    writer.putBits(32, 0);  // length

    vector<MPLSStreamInfo> pipStreams;
    unsigned mainVSize = 0, mainHSize = 0;
    for (auto& si : m_streamInfo)
    {
        const StreamType stream_coding_type = si.stream_coding_type;
        if (isVideoStreamType(stream_coding_type))
        {
            if (si.isSecondary)
            {
                pipStreams.push_back(si);
            }
            else
            {
                mainHSize = si.width;
                mainVSize = si.height;
            }
        }
    }

    const auto pipStreamsSize = static_cast<unsigned>(pipStreams.size());
    const auto pmtIndexListSize = static_cast<unsigned>(pmtIndexList.size());

    writer.putBits(16, pipStreamsSize * pmtIndexListSize);
    vector<uint32_t*> blockDataAddressPos;
    for (unsigned i = 0; i < pmtIndexListSize; ++i)
    {
        for (unsigned k = 0; k < pipStreamsSize; k++)
        {
            const PIPParams pipParams = pipStreams[k].pipParams;
            // metadata_block_header[k]() {
            writer.putBits(16, i);  // ref_to_PlayItem_id
            writer.putBits(8, k);   // ref_to_secondary_video_stream_id
            writer.putBits(8, 0);   // reserved_for_future_use
            // pip_timeline_type == 1. Synchronous type of Picture-in-Picture
            writer.putBits(4, pipParams.lumma >= 0 ? 1 : 0);
            writer.putBit(1);       // is_luma_key = 0
            writer.putBit(1);       // trick_playing_flag. keep PIP windows when tricking
            writer.putBits(10, 0);  // reserved_for_word_align
            writer.putBits(8, 0);   // reserved_for_future_use
            if (pipParams.lumma >= 0)
            {                                        // is_luma_key==1b
                writer.putBits(8, pipParams.lumma);  // transparent Y pixels
            }
            else
            {
                writer.putBits(8, 0);  // reserved_for_future_use
            }
            writer.putBits(16, 0);  // reserved_for_future_use
            blockDataAddressPos.push_back(reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8));
            writer.putBits(32, 0);  // metadata_block_data_start_address
        }
    }
    while (writer.getBitsCount() % 16 != 0) writer.putBit(0);
    for (size_t i = 0; i < pmtIndexList.size(); ++i)
    {
        for (size_t k = 0; k < pipStreams.size(); ++k)
        {
            PIPParams pipParams = pipStreams[k].pipParams;

            *(blockDataAddressPos[i * pipStreams.size() + k]) = my_htonl(writer.getBitsCount() / 8);

            writer.putBits(16, 1);  // number_of_pip_metadata_entries
            {
                if (i != 0 && !pmtIndexList[i - 1].empty())
                    writer.putBits(32, static_cast<unsigned>(pmtIndexList[i].begin()->first / 2));
                else
                    writer.putBits(32, IN_time);

                unsigned hPos = 0;
                unsigned vPos = 0;

                if (!pipParams.isFullScreen())
                {
                    hPos = pipParams.hOffset;
                    vPos = pipParams.vOffset;

                    const int pipWidth =
                        static_cast<int>(static_cast<float>(pipStreams[k].width) * pipParams.getScaleCoeff());
                    const int pipHeight =
                        static_cast<int>(static_cast<float>(pipStreams[k].height) * pipParams.getScaleCoeff());

                    if (pipParams.corner == PIPParams::PipCorner::TopRight ||
                        pipParams.corner == PIPParams::PipCorner::BottomRight)
                        hPos = mainHSize - pipWidth - pipParams.hOffset;
                    if (pipParams.corner == PIPParams::PipCorner::BottomRight ||
                        pipParams.corner == PIPParams::PipCorner::BottomLeft)
                        vPos = mainVSize - pipHeight - pipParams.vOffset;
                }

                writer.putBits(12, hPos);
                writer.putBits(12, vPos);

                writer.putBits(4, pipParams.scaleIndex);  // pip_scale[i]. 1 == no_scale
                writer.putBits(4, 0);                     // reserved_for_future_use
            }
            while (writer.getBitsCount() % 16 != 0) writer.putBit(0);
        }
    }

    writer.flushBits();
    *lengthPos = my_htonl(writer.getBitsCount() / 8 - 4);
    return writer.getBitsCount() / 8;
}